

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O1

void __thiscall Gluco::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  vec<Gluco::Solver::Watcher> *pvVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::cleanAll
            (&this->watches);
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::cleanAll
            (&this->watchesBin);
  if (0 < (this->vardata).sz) {
    lVar5 = 0;
    do {
      lVar10 = 0;
      do {
        lVar9 = lVar10 + lVar5 * 2;
        pvVar7 = (this->watches).occs.data;
        if (0 < pvVar7[lVar9].sz) {
          pvVar7 = pvVar7 + lVar9;
          lVar8 = 0;
          lVar6 = 0;
          do {
            ClauseAllocator::reloc(&this->ca,(CRef *)((long)&pvVar7->data->cref + lVar8),to);
            lVar6 = lVar6 + 1;
            lVar8 = lVar8 + 8;
          } while (lVar6 < pvVar7->sz);
        }
        pvVar7 = (this->watchesBin).occs.data;
        if (0 < pvVar7[lVar9].sz) {
          pvVar7 = pvVar7 + lVar9;
          lVar9 = 0;
          lVar6 = 0;
          do {
            ClauseAllocator::reloc(&this->ca,(CRef *)((long)&pvVar7->data->cref + lVar9),to);
            lVar6 = lVar6 + 1;
            lVar9 = lVar9 + 8;
          } while (lVar6 < pvVar7->sz);
        }
        bVar11 = lVar10 == 0;
        lVar10 = lVar10 + 1;
      } while (bVar11);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->vardata).sz);
  }
  if (0 < (this->trail).sz) {
    lVar5 = 0;
    do {
      iVar3 = (this->trail).data[lVar5].x >> 1;
      uVar1 = (this->vardata).data[iVar3].reason;
      uVar4 = (ulong)uVar1;
      if (uVar4 != 0xffffffff) {
        if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= uVar1) {
          __assert_fail("r >= 0 && r < sz",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Alloc.h"
                        ,0x42,
                        "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                       );
        }
        puVar2 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        if ((puVar2[uVar4] & 0x10) == 0) {
          bVar11 = locked(this,(Clause *)(puVar2 + uVar4));
          if (!bVar11) goto LAB_005c0b85;
        }
        ClauseAllocator::reloc(&this->ca,&(this->vardata).data[iVar3].reason,to);
      }
LAB_005c0b85:
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->trail).sz);
  }
  if (0 < (this->learnts).sz) {
    lVar10 = 0;
    lVar5 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->learnts).data + lVar10),to);
      lVar5 = lVar5 + 1;
      lVar10 = lVar10 + 4;
    } while (lVar5 < (this->learnts).sz);
  }
  if (0 < (this->clauses).sz) {
    lVar10 = 0;
    lVar5 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->clauses).data + lVar10),to);
      lVar5 = lVar5 + 1;
      lVar10 = lVar10 + 4;
    } while (lVar5 < (this->clauses).sz);
  }
  return;
}

Assistant:

void Solver::relocAll(ClauseAllocator& to)
{
    int v, s, i, j;
    // All watchers:
    //
    // for (int i = 0; i < watches.size(); i++)
    watches.cleanAll();
    watchesBin.cleanAll();
    for (v = 0; v < nVars(); v++)
        for (s = 0; s < 2; s++){
            Lit p = mkLit(v, s != 0);
            // printf(" >>> RELOCING: %s%d\n", sign(p)?"-":"", var(p)+1);
            vec<Watcher>& ws = watches[p];
            for (j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
            vec<Watcher>& ws2 = watchesBin[p];
            for (j = 0; j < ws2.size(); j++)
                ca.reloc(ws2[j].cref, to);
        }

    // All reasons:
    //
    for (i = 0; i < trail.size(); i++){
        Var v = var(trail[i]);

        if (reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)])))
            ca.reloc(vardata[v].reason, to);
    }

    // All learnt:
    //
    for (i = 0; i < learnts.size(); i++)
        ca.reloc(learnts[i], to);

    // All original:
    //
    for (i = 0; i < clauses.size(); i++)
        ca.reloc(clauses[i], to);
}